

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.h
# Opt level: O0

void __thiscall
flatbuffers::BaseGenerator::BaseGenerator
          (BaseGenerator *this,Parser *parser,string *path,string *file_name,
          string *qualifying_start,string *qualifying_separator,string *default_extension)

{
  string *qualifying_separator_local;
  string *qualifying_start_local;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  BaseGenerator *this_local;
  
  this->_vptr_BaseGenerator = (_func_int **)&PTR___cxa_pure_virtual_004f9428;
  this->parser_ = parser;
  this->path_ = path;
  this->file_name_ = file_name;
  std::__cxx11::string::string((string *)&this->qualifying_start_,(string *)qualifying_start);
  std::__cxx11::string::string
            ((string *)&this->qualifying_separator_,(string *)qualifying_separator);
  std::__cxx11::string::string((string *)&this->default_extension_,(string *)default_extension);
  return;
}

Assistant:

BaseGenerator(const Parser &parser, const std::string &path,
                const std::string &file_name, std::string qualifying_start,
                std::string qualifying_separator, std::string default_extension)
      : parser_(parser),
        path_(path),
        file_name_(file_name),
        qualifying_start_(qualifying_start),
        qualifying_separator_(qualifying_separator),
        default_extension_(default_extension) {}